

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

void __thiscall
FIX::SocketMonitor::block(SocketMonitor *this,Strategy *strategy,bool should_poll,double timeout)

{
  _Rb_tree_header *p_Var1;
  _Map_pointer ppiVar2;
  uint *puVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int *p_Var6;
  long lVar7;
  Strategy *pSVar8;
  _Rb_tree_node_base *p_Var9;
  clock_t cVar10;
  int iVar11;
  undefined7 in_register_00000011;
  nfds_t __nfds;
  uint pfds_size;
  ulong uVar12;
  pollfd *__fds;
  double dVar13;
  undefined8 uStack_60;
  pollfd local_58;
  nfds_t local_50;
  Strategy *local_48;
  undefined1 *local_40;
  double local_38;
  
  do {
    ppiVar2 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    puVar3 = (uint *)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_last - (long)puVar3 >> 2) +
        ((long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)ppiVar2 -
                  (long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppiVar2 == (_Map_pointer)0x0)) * 0x80 == 0) {
      local_38 = (double)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000011,should_poll));
      local_58 = (pollfd)((this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count
                          + (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                         (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      lVar7 = -(((ulong)local_58 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0);
      __fds = (pollfd *)((long)&local_58 + lVar7);
      p_Var9 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
      local_40 = (undefined1 *)&local_58;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        uVar12 = 0;
        local_40 = (undefined1 *)&local_58;
        do {
          __fds[uVar12].fd = p_Var9[1]._M_color;
          *(undefined4 *)((long)&local_58 + uVar12 * 8 + lVar7 + 4) = 3;
          uVar12 = (ulong)((int)uVar12 + 1);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5dac;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      p_Var9 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar4 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      p_Var1 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header;
      local_48 = strategy;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        uVar12 = 0;
        do {
          __fds[sVar4 + uVar12].fd = p_Var9[1]._M_color;
          __fds[sVar4 + uVar12].events = 0xc;
          __fds[sVar4 + uVar12].revents = 0;
          uVar12 = (ulong)((int)uVar12 + 1);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5df2;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      p_Var9 = (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        sVar5 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        uVar12 = 0;
        do {
          __fds[sVar4 + sVar5 + uVar12].fd = p_Var9[1]._M_color;
          __fds[sVar4 + sVar5 + uVar12].events = 4;
          __fds[sVar4 + sVar5 + uVar12].revents = 0;
          uVar12 = (ulong)((int)uVar12 + 1);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5e33;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      pSVar8 = local_48;
      if ((((SUB81(local_38,0) == '\0') &&
           ((this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
          ((this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         ((this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        iVar11 = this->m_timeout;
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5e61;
        process_sleep((double)iVar11);
        pSVar8 = local_48;
        p_Var6 = local_48->_vptr_Strategy[7];
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5e6e;
        (*p_Var6)(pSVar8,this);
      }
      else {
        pfds_size = local_58.fd;
        __nfds = (nfds_t)(int)pfds_size;
        iVar11 = 0;
        if ((SUB81(local_38,0) == '\0') && (iVar11 = 0, this->m_timeout != 0)) {
          local_38 = (double)this->m_timeout;
          local_50 = __nfds;
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5ea5;
          cVar10 = clock();
          dVar13 = (double)(cVar10 - this->m_ticks) / 1000000.0;
          if ((local_38 <= dVar13) || ((dVar13 == 0.0 && (!NAN(dVar13))))) {
            *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5ee0;
            cVar10 = clock();
            this->m_ticks = cVar10;
            dVar13 = local_38;
          }
          else {
            dVar13 = local_38 - dVar13;
          }
          iVar11 = (int)(dVar13 * 1000.0);
          __nfds = local_50;
        }
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5f01;
        iVar11 = poll(__fds,__nfds,iVar11);
        if (iVar11 == 0) {
          p_Var6 = pSVar8->_vptr_Strategy[7];
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5f26;
          (*p_Var6)(pSVar8,this);
        }
        else if (iVar11 < 1) {
          p_Var6 = pSVar8->_vptr_Strategy[6];
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5f34;
          (*p_Var6)(pSVar8,this);
        }
        else {
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1c5f18;
          processPollList(this,pSVar8,(pollfd *)__fds,pfds_size);
        }
      }
      return;
    }
    uStack_60 = 0x1c5ced;
    (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)*puVar3);
    uStack_60 = 0x1c5cf5;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_dropped).c);
    ppiVar2 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  } while (((long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last -
            (long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur >> 2) +
           ((long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur -
            (long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first >> 2) +
           ((((ulong)((long)ppiVar2 -
                     (long)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(ppiVar2 == (_Map_pointer)0x0)) * 0x80 != 0);
  return;
}

Assistant:

void SocketMonitor::block(Strategy &strategy, bool should_poll, double timeout) {
  while (m_dropped.size()) {
    strategy.onError(*this, m_dropped.front());
    m_dropped.pop();
    if (m_dropped.size() == 0) {
      return;
    }
  }

  int pfds_size = m_readSockets.size() + m_connectSockets.size() + m_writeSockets.size();
  struct pollfd pfds[pfds_size];
  buildSet(m_readSockets, pfds, POLLPRI | POLLIN);
  buildSet(m_connectSockets, pfds + m_readSockets.size(), POLLOUT | POLLERR);
  buildSet(m_writeSockets, pfds + m_readSockets.size() + m_connectSockets.size(), POLLOUT);

  if (sleepIfEmpty(should_poll)) {
    strategy.onTimeout(*this);
    return;
  }

  int result = poll(pfds, pfds_size, getTimeval(should_poll, timeout));

  if (result == 0) {
    strategy.onTimeout(*this);
    return;
  } else if (result > 0) {
    processPollList(strategy, pfds, pfds_size);
  } else {
    strategy.onError(*this);
  }
}